

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cc
# Opt level: O2

void __thiscall wabt::Var::set_name(Var *this,string_view name)

{
  string local_48;
  undefined1 local_28 [8];
  string_view name_local;
  
  name_local.data_ = (char *)name.size_;
  local_28 = (undefined1  [8])name.data_;
  string_view::to_string_abi_cxx11_(&local_48,(string_view *)local_28);
  set_name(this,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  return;
}

Assistant:

void Var::set_name(string_view name) {
  set_name(name.to_string());
}